

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensembletobin.cpp
# Opt level: O0

void ensembletobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint local_101c;
  char local_1018 [4];
  int lineno;
  char line [4096];
  undefined1 local_10 [4];
  undefined1 auStack_c [4];
  Ensemble q;
  
  fgets(local_1018,0x1000,_stdin);
  local_101c = 1;
  while( true ) {
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(local_1018,"%d,%d",local_10,auStack_c);
    if (iVar1 != 2) break;
    fwrite(local_10,8,1,_stdout);
    local_101c = local_101c + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)local_101c,local_1018);
  return;
}

Assistant:

void doit() {

    Ensemble q;
    char line[4096];
    int lineno = 0;
    fgets(line, sizeof(line), stdin);   // Read column headings
    lineno++;

    // Read data
    while(fgets(line, sizeof(line), stdin) != 0) {
      if (sscanf(line, "%d,%d", &q.sidx, &q.ensemble_id) != 2) {

	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
	return;

      } else {

	fwrite(&q, sizeof(q), 1, stdout);

      }
      lineno++;
    }

  }